

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool operator<(CService *a,CService *b)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffff38;
  CNetAddr *in_stack_ffffffffffffff40;
  undefined5 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 in_stack_ffffffffffffff50;
  bool bVar3;
  undefined1 in_stack_ffffffffffffff51;
  byte bVar4;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT15(in_stack_ffffffffffffff4d,in_stack_ffffffffffffff48)
                                      )),in_stack_ffffffffffffff40);
  bVar5 = 0;
  bVar4 = 0;
  CNetAddr::CNetAddr((CNetAddr *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT15(in_stack_ffffffffffffff4d,in_stack_ffffffffffffff48)
                                      )),in_stack_ffffffffffffff40);
  bVar2 = operator<((CNetAddr *)
                    CONCAT44(in_stack_ffffffffffffff54,
                             CONCAT13(bVar5,CONCAT12(bVar4,CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))),
                    (CNetAddr *)
                    CONCAT17(in_stack_ffffffffffffff4f,
                             CONCAT16(in_stack_ffffffffffffff4e,
                                      CONCAT15(in_stack_ffffffffffffff4d,in_stack_ffffffffffffff48))
                            ));
  bVar3 = true;
  if (!bVar2) {
    CNetAddr::CNetAddr((CNetAddr *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))),
                       in_stack_ffffffffffffff40);
    bVar5 = 1;
    CNetAddr::CNetAddr((CNetAddr *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))),
                       in_stack_ffffffffffffff40);
    bVar4 = 1;
    bVar2 = operator==((CNetAddr *)
                       CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))),
                       in_stack_ffffffffffffff40);
    bVar3 = false;
    if (bVar2) {
      bVar3 = *(ushort *)(in_RDI + 0x20) < *(ushort *)(in_RSI + 0x20);
    }
  }
  if ((bVar4 & 1) != 0) {
    CNetAddr::~CNetAddr(in_stack_ffffffffffffff38);
  }
  if ((bVar5 & 1) != 0) {
    CNetAddr::~CNetAddr(in_stack_ffffffffffffff38);
  }
  CNetAddr::~CNetAddr(in_stack_ffffffffffffff38);
  CNetAddr::~CNetAddr(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool operator<(const CService& a, const CService& b)
{
    return static_cast<CNetAddr>(a) < static_cast<CNetAddr>(b) || (static_cast<CNetAddr>(a) == static_cast<CNetAddr>(b) && a.port < b.port);
}